

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_x931.c
# Opt level: O0

int RSA_padding_check_X931(uchar *to,int tlen,uchar *f,int fl,int rsa_len)

{
  int iVar1;
  uchar *__src;
  uchar c;
  uchar *p;
  int j;
  int i;
  undefined7 in_stack_ffffffffffffffc0;
  uchar in_stack_ffffffffffffffc7;
  uchar *puVar2;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  uint local_4;
  
  iVar3 = 0;
  if ((rsa_len == fl) && ((*f == 'j' || (*f == 'k')))) {
    __src = f + 1;
    if (*f == 'k') {
      iVar1 = fl + -3;
      puVar2 = __src;
      for (iVar3 = 0; __src = puVar2, iVar3 < iVar1; iVar3 = iVar3 + 1) {
        __src = puVar2 + 1;
        in_stack_ffffffffffffffc7 = *puVar2;
        if (in_stack_ffffffffffffffc7 == 0xba) break;
        if (in_stack_ffffffffffffffc7 != 0xbb) {
          ERR_new();
          ERR_set_debug((char *)CONCAT44(iVar3,iVar1),(int)((ulong)__src >> 0x20),
                        (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
          ERR_set_error(4,0x8a,(char *)0x0);
          return -1;
        }
        puVar2 = __src;
      }
      local_4 = iVar1 - iVar3;
      if (iVar3 == 0) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(iVar3,local_4),(int)((ulong)__src >> 0x20),
                      (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        ERR_set_error(4,0x8a,(char *)0x0);
        return -1;
      }
    }
    else {
      local_4 = fl - 2;
    }
    if (__src[(int)local_4] == 0xcc) {
      memcpy(to,__src,(ulong)local_4);
    }
    else {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(iVar3,local_4),(int)((ulong)__src >> 0x20),
                    (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      ERR_set_error(4,0x8b,(char *)0x0);
      local_4 = 0xffffffff;
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),(int)((ulong)f >> 0x20),
                  (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    ERR_set_error(4,0x89,(char *)0x0);
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int RSA_padding_check_X931(unsigned char *to, int tlen,
                           const unsigned char *from, int flen, int num)
{
    int i = 0, j;
    const unsigned char *p;

    p = from;
    if ((num != flen) || ((*p != 0x6A) && (*p != 0x6B))) {
        ERR_raise(ERR_LIB_RSA, RSA_R_INVALID_HEADER);
        return -1;
    }

    if (*p++ == 0x6B) {
        j = flen - 3;
        for (i = 0; i < j; i++) {
            unsigned char c = *p++;
            if (c == 0xBA)
                break;
            if (c != 0xBB) {
                ERR_raise(ERR_LIB_RSA, RSA_R_INVALID_PADDING);
                return -1;
            }
        }

        j -= i;

        if (i == 0) {
            ERR_raise(ERR_LIB_RSA, RSA_R_INVALID_PADDING);
            return -1;
        }

    } else {
        j = flen - 2;
    }

    if (p[j] != 0xCC) {
        ERR_raise(ERR_LIB_RSA, RSA_R_INVALID_TRAILER);
        return -1;
    }

    memcpy(to, p, (unsigned int)j);

    return j;
}